

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_uint64_128_640(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  int iVar1;
  word mask;
  ulong uVar2;
  int iVar3;
  long lVar4;
  mzd_local_t *rblock;
  bool bVar5;
  word *local_50;
  
  iVar3 = 2;
  clear_uint64_blocks(c,2);
  clear_uint64_block(c + 2,2);
  local_50 = v->w64;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    uVar2 = *local_50;
    iVar1 = 0x40;
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      mask = -(ulong)((uint)uVar2 & 1);
      lVar4 = 2;
      rblock = c;
      while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
        mzd_xor_mask_uint64_block(rblock,A,mask,4);
        rblock = rblock + 1;
        A = A + 1;
      }
      mzd_xor_mask_uint64_block(c + 2,A,mask,2);
      A = A + 1;
      uVar2 = uVar2 >> 1;
    }
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void mzd_mul_v_uint64_128_640(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  clear_uint64_blocks(BLOCK(c, 0), 2);
  clear_uint64_block(BLOCK(c, 2), 2);

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      for (unsigned int j = 0; j < 2; ++j, ++Ablock) {
        mzd_xor_mask_uint64_block(BLOCK(c, j), Ablock, mask, 4);
      }
      mzd_xor_mask_uint64_block(BLOCK(c, 2), Ablock, mask, 2);
    }
  }
}